

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O3

void test_inline_array(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 in_RAX;
  undefined8 uVar6;
  undefined8 extraout_RAX;
  bson_t *bson;
  char *pcVar7;
  char *__buf;
  char *__n;
  void *pvVar8;
  void *__s2;
  char *pcVar9;
  char *pcVar10;
  char *extraout_RAX_00;
  dirent *pdVar11;
  size_t sVar12;
  size_t sVar13;
  DIR *__dirp;
  FILE *__stream;
  long lVar14;
  char *pcVar15;
  uint extraout_EDX;
  char *__dest;
  int paths_index;
  char *pcVar16;
  ulong uVar17;
  DIR *__s;
  DIR *__name;
  char *pcVar18;
  DIR *paths;
  DIR *__filename;
  undefined8 uVar19;
  char *pcVar20;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auStack_6e88 [8];
  undefined1 auStack_6e80 [504];
  ulong uStack_6c88;
  DIR *pDStack_6c80;
  dirent *pdStack_6c78;
  DIR *pDStack_6c70;
  DIR *pDStack_6c68;
  stat sStack_6c60;
  char acStack_6bd0 [512];
  size_t sStack_69d0;
  dirent *pdStack_69c8;
  DIR *pDStack_69c0;
  char *pcStack_69b8;
  code *pcStack_69b0;
  char *pcStack_69a8;
  ulong uStack_69a0;
  char *pcStack_6998;
  DIR *pDStack_6990;
  code *pcStack_6988;
  undefined8 uStack_6950;
  undefined1 *puStack_6948;
  undefined1 *puStack_6940;
  undefined1 auStack_6930 [8];
  char *pcStack_6928;
  char *pcStack_6918;
  char *pcStack_6910;
  undefined8 uStack_6908;
  undefined8 uStack_68f0;
  DIR aDStack_6880 [25944];
  char *pcStack_328;
  char *pcStack_320;
  char *pcStack_318;
  char *pcStack_310;
  code *apcStack_308 [2];
  undefined1 auStack_2f8 [116];
  uint uStack_284;
  char acStack_280 [256];
  undefined8 uStack_180;
  char *pcStack_178;
  char *pcStack_170;
  char *pcStack_168;
  char *pcStack_160;
  char *pcStack_158;
  char *pcStack_150;
  undefined8 uStack_148;
  code *pcStack_140;
  char *pcStack_138;
  undefined8 uStack_130;
  char *pcStack_128;
  char *pcStack_120;
  char *pcStack_118;
  char *pcStack_110;
  code *pcStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  char *pcStack_f0;
  char *pcStack_e8;
  char *pcStack_e0;
  undefined8 uStack_d8;
  bson_t *pbStack_d0;
  char *pcStack_c8;
  code *pcStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  char *pcStack_a0;
  char *pcStack_98;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  code *pcStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined1 *puStack_58;
  char *pcStack_50;
  char *pcStack_48;
  code *pcStack_40;
  int32_t b;
  int32_t a;
  
  pcStack_40 = (code *)0x13d679;
  _b = in_RAX;
  uStack_68 = bson_bcon_magic();
  pcStack_48 = (char *)0x0;
  pcStack_50 = "]";
  puStack_58 = (undefined1 *)0x2;
  uStack_60 = 0xf;
  uStack_70 = 0x13d6c1;
  uVar6 = bcon_new(0,"foo","[",uStack_68,0xf,1);
  pcStack_40 = (code *)0x13d6cd;
  uStack_68 = bson_bcone_magic();
  pcStack_48 = (char *)0x0;
  pcStack_50 = "]";
  uStack_60 = 0xf;
  uStack_70 = 0x13d6fc;
  puStack_58 = (undefined1 *)&b;
  cVar1 = bcon_extract(uVar6,"foo","[",uStack_68,0xf,&a);
  if (cVar1 == '\0') {
    pcStack_40 = (code *)0x13d72d;
    test_inline_array_cold_1();
LAB_0013d72d:
    pcStack_40 = (code *)0x13d732;
    test_inline_array_cold_2();
  }
  else {
    if (a != 1) goto LAB_0013d72d;
    if (b == 2) {
      pcStack_40 = (code *)0x13d719;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_40 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_40 = (code *)0x14a05b;
  pcStack_48 = "[";
  pcStack_50 = "foo";
  puStack_58 = (undefined1 *)0x0;
  uStack_60 = 0xf;
  pcStack_78 = (code *)0x13d747;
  uStack_70 = extraout_RAX;
  uStack_68 = uVar6;
  pcStack_a0 = (char *)bson_bcon_magic();
  pcStack_80 = (char *)0x0;
  pcStack_88 = "}";
  pcStack_90 = (char *)0x1;
  pcStack_98 = (char *)0xf;
  uStack_a8 = "a";
  uStack_b0 = 2;
  uStack_b8 = 0x13d79a;
  uVar6 = bcon_new(0,"foo","{","b",pcStack_a0,0xf);
  pcStack_78 = (code *)0x13d7a6;
  pcStack_a0 = (char *)bson_bcone_magic();
  uStack_b0 = (long)&uStack_70 + 4;
  pcStack_80 = (char *)0x0;
  pcStack_88 = "}";
  pcStack_98 = (char *)0xf;
  uStack_a8 = "b";
  uStack_b8 = 0x13d7e9;
  pcStack_90 = (char *)&uStack_70;
  cVar1 = bcon_extract(uVar6,"foo","{","a",pcStack_a0,0xf);
  if (cVar1 == '\0') {
    pcStack_78 = (code *)0x13d81a;
    test_inline_doc_cold_1();
LAB_0013d81a:
    pcStack_78 = (code *)0x13d81f;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_70._4_4_ != 1) goto LAB_0013d81a;
    if ((int)uStack_70 == 2) {
      pcStack_78 = (code *)0x13d806;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_78 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_78 = (code *)0x0;
  pcStack_80 = "a";
  pcStack_90 = "{";
  pcStack_98 = "foo";
  pcStack_a0 = "}";
  pcStack_c0 = (code *)0x13d837;
  pcStack_88 = (char *)uVar6;
  uStack_f8 = (undefined8 *)bson_bcon_magic();
  pcStack_c0 = (code *)0x0;
  pcStack_c8 = (char *)0x3;
  pbStack_d0 = (bson_t *)0xf;
  pcStack_e0 = "c";
  pcStack_e8 = (char *)0x2;
  pcStack_f0 = (char *)0xf;
  uStack_100 = 0x13d879;
  uStack_d8 = uStack_f8;
  bson = (bson_t *)bcon_new(0,"a",uStack_f8,0xf,1,"b");
  pcStack_c0 = (code *)0x13d885;
  pcStack_108 = (code *)bson_bcone_magic();
  pbStack_d0 = (bson_t *)((long)&uStack_b0 + 4);
  uStack_f8 = &uStack_a8;
  pcStack_c8 = (char *)0x0;
  uStack_d8 = 0xf;
  pcStack_e8 = "c";
  pcStack_f0 = (char *)0x0;
  uStack_100 = 0xf;
  pcStack_110 = "b";
  pcStack_118 = (char *)0x0;
  pcStack_120 = (char *)0x13d8d1;
  pcStack_e0 = (char *)pcStack_108;
  test_extract_ctx_helper(bson,3,"a",pcStack_108,0xf,(long)&uStack_a8 + 4);
  if (uStack_a8._4_4_ == 1) {
    if ((int)uStack_a8 != 2) goto LAB_0013d906;
    if (uStack_b0._4_4_ == 3) {
      pcStack_c0 = (code *)0x13d8f2;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_c0 = (code *)0x13d906;
    test_extract_ctx_cold_1();
LAB_0013d906:
    pcStack_c0 = (code *)0x13d90b;
    test_extract_ctx_cold_2();
  }
  pcStack_c0 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_c0 = (code *)0xf;
  pcStack_c8 = "a";
  uStack_d8 = 0;
  pcStack_e8 = "c";
  pcStack_108 = (code *)0x13d923;
  pcStack_e0 = (char *)((long)&uStack_a8 + 4);
  pbStack_d0 = bson;
  uStack_130 = bson_bcon_magic();
  pcStack_110 = (char *)0x0;
  pcStack_118 = "}";
  pcStack_120 = (char *)0xa;
  pcStack_128 = (char *)0xf;
  pcStack_138 = (char *)0x13d978;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_108 = (code *)0x13d984;
  uStack_130 = bson_bcone_magic();
  pcStack_120 = (char *)((long)&uStack_f8 + 4);
  pcStack_110 = (char *)0x0;
  pcStack_118 = "}";
  pcStack_128 = (char *)0xf;
  pcStack_138 = "bar";
  pcStack_140 = (code *)0x141970;
  uStack_148 = 0x13d9c0;
  cVar1 = bcon_extract(uVar6,"hello",uStack_130,0,&pcStack_f0,"foo");
  if (cVar1 == '\0') {
    pcStack_108 = (code *)0x13da00;
    test_nested_cold_1();
LAB_0013da00:
    pcStack_108 = (code *)0x13da05;
    test_nested_cold_2();
  }
  else {
    pcStack_108 = (code *)0x13d9d9;
    iVar2 = strcmp("world",pcStack_f0);
    if (iVar2 != 0) goto LAB_0013da00;
    if (uStack_f8._4_4_ == 10) {
      pcStack_108 = (code *)0x13d9ec;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_108 = test_skip;
  test_nested_cold_3();
  pcStack_108 = (code *)0x14ad57;
  pcStack_110 = "bar";
  pcStack_118 = (char *)0x0;
  pcStack_120 = "hello";
  pcStack_128 = "foo";
  pcStack_140 = (code *)0x13da1a;
  uStack_130 = uVar6;
  pcStack_168 = (char *)bson_bcon_magic();
  uStack_148 = 0;
  pcStack_150 = "}";
  pcStack_158 = (char *)0xa;
  pcStack_160 = (char *)0xf;
  pcStack_170 = (char *)0x13da6d;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_140 = (code *)0x13da79;
  pcVar7 = (char *)bson_bcone_magic();
  pcVar20 = "}";
  uStack_148 = 0;
  pcStack_150 = "}";
  pcStack_158 = (char *)0x10;
  pcStack_160 = (char *)0x1c;
  pcStack_170 = "bar";
  pcStack_178 = "{";
  uStack_180 = 0x13dab5;
  pcStack_168 = pcVar7;
  cVar1 = bcon_extract(uVar6,"hello",pcVar7,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_140 = (code *)0x13db17;
    test_skip_cold_1();
  }
  else {
    uStack_148 = 0;
    pcStack_150 = "}";
    pcStack_158 = (char *)0x12;
    pcStack_160 = (char *)0x1c;
    pcStack_170 = "bar";
    pcStack_178 = "{";
    uStack_180 = 0x13daf4;
    pcStack_168 = pcVar7;
    cVar1 = bcon_extract(uVar6,"hello",pcVar7,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_140 = test_iter;
  test_skip_cold_2();
  pcStack_140 = (code *)0x14e902;
  pcStack_150 = "bar";
  pcStack_158 = "}";
  pcStack_168 = "{";
  apcStack_308[0] = (code *)0x13db39;
  pcStack_160 = pcVar7;
  uStack_148 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_308[0] = (code *)0x13db60;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_308[0] = (code *)0x13db68;
  uVar6 = bson_bcone_magic();
  pcVar9 = acStack_280;
  pcVar16 = "foo";
  pcVar15 = (char *)0x1d;
  uVar19 = 0;
  apcStack_308[0] = (code *)0x13db88;
  pcVar18 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  if (cVar1 == '\0') {
    apcStack_308[0] = (code *)0x13dd34;
    uVar6 = extraout_XMM1_Qa;
    test_iter_cold_1();
LAB_0013dd34:
    apcStack_308[0] = (code *)0x13dd39;
    test_iter_cold_2();
  }
  else {
    pcVar18 = acStack_280;
    apcStack_308[0] = (code *)0x13db9d;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013dd34;
    pcVar18 = acStack_280;
    apcStack_308[0] = (code *)0x13dbb3;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 == 10) {
      uVar19 = 0;
      apcStack_308[0] = (code *)0x13dbdf;
      __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_280);
      apcStack_308[0] = (code *)0x13dbea;
      pcVar7 = (char *)bson_get_data(__n_00);
      apcStack_308[0] = (code *)0x13dbf5;
      __buf = (char *)bson_get_data(__n);
      if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
        apcStack_308[0] = (code *)0x13dc09;
        pvVar8 = (void *)bson_get_data(__n);
        apcStack_308[0] = (code *)0x13dc14;
        __s2 = (void *)bson_get_data(__n_00);
        apcStack_308[0] = (code *)0x13dc22;
        iVar2 = bcmp(pvVar8,__s2,(ulong)*(uint *)(__n + 4));
        if (iVar2 == 0) {
          apcStack_308[0] = (code *)0x13dc2e;
          bson_destroy(__n);
          apcStack_308[0] = (code *)0x13dc36;
          bson_destroy(__n_00);
          return;
        }
      }
      apcStack_308[0] = (code *)0x13dc4f;
      pcVar20 = (char *)bson_as_canonical_extended_json(__n_00);
      apcStack_308[0] = (code *)0x13dc5c;
      pcVar9 = (char *)bson_as_canonical_extended_json(__n);
      uVar3 = *(uint *)(__n_00 + 4);
      uVar4 = *(uint *)(__n + 4);
      uVar6 = extraout_XMM1_Qa_02;
      if (uVar3 != 0) {
        uVar17 = 0;
        do {
          if (uVar4 == (uint)uVar17) break;
          if (pcVar7[uVar17] != __buf[uVar17]) goto LAB_0013dd28;
          uVar17 = uVar17 + 1;
        } while (uVar3 != (uint)uVar17);
      }
      if (uVar3 < uVar4) {
        uVar3 = uVar4;
      }
      uVar17 = (ulong)(uVar3 - 1);
      pcVar15 = pcVar20;
      while( true ) {
        apcStack_308[0] = (code *)0x13dca8;
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar17);
        apcStack_308[0] = (code *)0x13dcc0;
        uVar3 = open("failure.bad.bson",0x42,0x1a0);
        pcVar20 = (char *)(ulong)uVar3;
        pcVar18 = "failure.expected.bson";
        pcVar16 = (char *)0x42;
        apcStack_308[0] = (code *)0x13dcdb;
        uVar4 = open("failure.expected.bson",0x42,0x1a0);
        uStack_284 = uVar3;
        if (uVar3 == 0xffffffff) break;
        if (uVar4 == 0xffffffff) goto LAB_0013dd43;
        pcVar20 = (char *)(ulong)uVar4;
        __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
        pcVar18 = (char *)(ulong)uVar3;
        apcStack_308[0] = (code *)0x13dd01;
        pcVar16 = pcVar7;
        pcVar10 = (char *)write(uVar3,pcVar7,(size_t)__n_00);
        if (pcVar10 != __n_00) goto LAB_0013dd48;
        __n = (char *)(ulong)*(uint *)(__n + 4);
        apcStack_308[0] = (code *)0x13dd17;
        pcVar16 = __buf;
        pcVar18 = pcVar20;
        pcVar10 = (char *)write(uVar4,__buf,(size_t)__n);
        if (pcVar10 != __n) goto LAB_0013dd4d;
        uVar17 = (ulong)uVar4;
        apcStack_308[0] = (code *)0x13dd28;
        test_iter_cold_6();
        pcVar9 = extraout_RAX_00;
LAB_0013dd28:
        uVar17 = uVar17 & 0xffffffff;
        pcVar15 = pcVar20;
      }
      goto LAB_0013dd3e;
    }
  }
  apcStack_308[0] = (code *)0x13dd3e;
  test_iter_cold_3();
LAB_0013dd3e:
  apcStack_308[0] = (code *)0x13dd43;
  test_iter_cold_8();
LAB_0013dd43:
  apcStack_308[0] = (code *)0x13dd48;
  test_iter_cold_7();
LAB_0013dd48:
  apcStack_308[0] = (code *)0x13dd4d;
  test_iter_cold_4();
LAB_0013dd4d:
  apcStack_308[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6940 = auStack_6930;
  if (extraout_AL != '\0') {
    uStack_68f0 = uVar6;
  }
  pcStack_6988 = (code *)0x13ddd5;
  pcStack_6928 = pcVar16;
  pcStack_6918 = pcVar15;
  pcStack_6910 = pcVar9;
  uStack_6908 = uVar19;
  pcStack_328 = __n;
  pcStack_320 = pcVar7;
  pcStack_318 = __buf;
  pcStack_310 = __n_00;
  apcStack_308[0] = (code *)&pcStack_140;
  bcon_extract_ctx_init(aDStack_6880);
  puStack_6948 = auStack_2f8;
  uStack_6950 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_6928) {
    uVar3 = (uint)pcStack_6928;
    do {
      pcStack_6988 = (code *)0x13de41;
      __s = aDStack_6880;
      pcVar7 = pcVar18;
      cVar1 = bcon_extract_ctx_va(pcVar18,aDStack_6880,&uStack_6950);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        pcStack_6988 = assemble_path;
        test_extract_ctx_helper_cold_1();
        pcStack_69b0 = (code *)0x13de73;
        __name = __s;
        pcStack_69a8 = pcVar18;
        uStack_69a0 = (ulong)uVar3;
        pcStack_6998 = pcVar20;
        pDStack_6990 = aDStack_6880;
        pcStack_6988 = (code *)&uStack_6950;
        pdVar11 = (dirent *)strlen(pcVar7);
        pcStack_69b0 = (code *)0x13de7e;
        paths = __s;
        sVar12 = strlen((char *)__s);
        if ((int)sVar12 + (int)pdVar11 < 499) {
          pcStack_69b0 = (code *)0x13de9a;
          memset(__dest,0,500);
          pcStack_69b0 = (code *)0x13dea8;
          strncat(__dest,pcVar7,(long)(int)pdVar11);
          pcStack_69b0 = (code *)0x13deb0;
          sVar13 = strlen(__dest);
          (__dest + sVar13)[0] = '/';
          (__dest + sVar13)[1] = '\0';
          pcStack_69b0 = (code *)0x13dec4;
          strncat(__dest,(char *)__s,(long)(int)sVar12);
          pcVar7 = __dest;
          do {
            if (*pcVar7 == '\\') {
              *pcVar7 = '/';
            }
            else if (*pcVar7 == '\0') {
              return;
            }
            pcVar7 = pcVar7 + 1;
          } while( true );
        }
        pcStack_69b0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar17 = (ulong)extraout_EDX;
        pDStack_6c68 = (DIR *)0x13df0c;
        __filename = __name;
        sStack_69d0 = sVar12;
        pdStack_69c8 = pdVar11;
        pDStack_69c0 = __s;
        pcStack_69b8 = pcVar7;
        pcStack_69b0 = (code *)apcStack_308;
        __dirp = opendir((char *)__name);
        pDStack_6c70 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013e018;
        pDStack_6c68 = (DIR *)0x13df20;
        __filename = __dirp;
        pdVar11 = readdir(__dirp);
        do {
          if (pdVar11 == (dirent *)0x0) {
LAB_0013dff7:
            pDStack_6c68 = (DIR *)0x13dfff;
            closedir(__dirp);
            return;
          }
          paths_index = (int)uVar17;
          if (iVar2 <= paths_index) {
            pDStack_6c68 = (DIR *)0x13e018;
            collect_tests_from_dir_cold_1();
            pDStack_6c70 = __dirp;
LAB_0013e018:
            pDStack_6c68 = (DIR *)get_bson_from_json_file;
            collect_tests_from_dir_cold_2();
            uStack_6c88 = uVar17;
            pDStack_6c80 = paths;
            pdStack_6c78 = pdVar11;
            pDStack_6c68 = __name;
            __stream = fopen((char *)__filename,"rb");
            if (__stream != (FILE *)0x0) {
              fseek(__stream,0,2);
              sVar12 = ftell(__stream);
              fseek(__stream,0,0);
              if (0 < (long)sVar12) {
                pvVar8 = (void *)bson_malloc0(sVar12);
                sVar13 = fread(pvVar8,1,sVar12,__stream);
                if (sVar13 != sVar12) {
                  abort();
                }
                fclose(__stream);
                if (pvVar8 != (void *)0x0) {
                  lVar14 = bson_new_from_json(pvVar8,sVar12,auStack_6e88);
                  if (lVar14 == 0) {
                    fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_6e80);
                    abort();
                  }
                  bson_free(pvVar8);
                }
              }
            }
            return;
          }
          while ((pdVar11->d_name[0] == '.' &&
                 (((pdVar11->d_name[1] == '.' && (pdVar11->d_name[2] == '\0')) ||
                  (pdVar11->d_name[1] == '\0'))))) {
            pDStack_6c68 = (DIR *)0x13df58;
            pdVar11 = readdir(__dirp);
            if (pdVar11 == (dirent *)0x0) goto LAB_0013dff7;
          }
          pcVar7 = pdVar11->d_name;
          pDStack_6c68 = (DIR *)0x13df7c;
          assemble_path((char *)__name,pcVar7,acStack_6bd0);
          pDStack_6c68 = (DIR *)0x13df87;
          iVar5 = stat(pcVar7,&sStack_6c60);
          if ((iVar5 == 0) && ((sStack_6c60.st_mode & 0xf000) == 0x4000)) {
            pDStack_6c68 = (DIR *)0x13dfb1;
            uVar3 = collect_tests_from_dir((char (*) [500])paths,acStack_6bd0,paths_index,iVar2);
            uVar17 = (ulong)uVar3;
          }
          else {
            pDStack_6c68 = (DIR *)0x13dfc4;
            pcVar20 = strstr(pcVar7,".json");
            if (pcVar20 != (char *)0x0) {
              uVar17 = (ulong)(paths_index + 1);
              pDStack_6c68 = (DIR *)0x13dfe3;
              assemble_path((char *)__name,pcVar7,(char *)(paths + (long)paths_index * 500));
            }
          }
          pDStack_6c68 = (DIR *)0x13dfeb;
          __filename = __dirp;
          pdVar11 = readdir(__dirp);
        } while( true );
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void
test_inline_array (void)
{
   bson_t bcon, expected, child;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);

   bson_append_utf8 (&child, "0", -1, "baz", -1);
   bson_append_array (&expected, "foo", -1, &child);

   BCON_APPEND (&bcon, "foo", "[", "baz", "]");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&child);
   bson_destroy (&expected);
}